

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gcc.c
# Opt level: O0

void bn_sqr_comba4(unsigned_long *r,unsigned_long *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong *in_RSI;
  undefined8 *in_RDI;
  unsigned_long t2_1;
  unsigned_long t1_1;
  unsigned_long t2;
  unsigned_long t1;
  unsigned_long c3;
  unsigned_long c2;
  unsigned_long c1;
  unsigned_long t2_9;
  unsigned_long t1_9;
  unsigned_long t2_8;
  unsigned_long t1_8;
  unsigned_long t2_7;
  unsigned_long t1_7;
  unsigned_long t2_6;
  unsigned_long t1_6;
  unsigned_long t2_5;
  unsigned_long t1_5;
  unsigned_long t2_4;
  unsigned_long t1_4;
  unsigned_long t2_3;
  unsigned_long t1_3;
  unsigned_long t2_2;
  unsigned_long t1_2;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *in_RSI;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *in_RSI;
  uVar33 = SUB168(auVar1 * auVar11,8);
  *in_RDI = SUB168(auVar1 * auVar11,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RSI[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *in_RSI;
  auVar2 = auVar2 * auVar12;
  uVar34 = auVar2._8_8_;
  auVar22._8_8_ = uVar34;
  auVar22._0_8_ = uVar33;
  uVar24 = auVar2._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar24;
  auVar2 = auVar2 + auVar22;
  uVar33 = (ulong)CARRY8(uVar33,uVar24);
  uVar29 = SUB168(auVar2 + auVar23,8);
  uVar25 = (ulong)CARRY8(uVar34,uVar33) +
           (ulong)(CARRY8(uVar34 + uVar33,uVar34) ||
                  CARRY8(auVar2._8_8_,(ulong)CARRY8(auVar2._0_8_,uVar24)));
  in_RDI[1] = SUB168(auVar2 + auVar23,0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RSI[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = in_RSI[1];
  uVar35 = SUB168(auVar3 * auVar13,8);
  uVar33 = SUB168(auVar3 * auVar13,0);
  uVar24 = uVar29 + uVar33;
  uVar33 = (ulong)CARRY8(uVar29,uVar33);
  uVar34 = uVar25 + uVar35;
  uVar30 = uVar34 + uVar33;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_RSI[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *in_RSI;
  uVar36 = SUB168(auVar4 * auVar14,8);
  uVar26 = SUB168(auVar4 * auVar14,0);
  uVar37 = uVar24 + uVar26;
  uVar24 = (ulong)CARRY8(uVar24,uVar26);
  uVar27 = uVar30 + uVar36;
  uVar31 = uVar27 + uVar24;
  uVar29 = (ulong)CARRY8(uVar37,uVar26);
  uVar28 = uVar31 + uVar36;
  uVar32 = uVar28 + uVar29;
  uVar30 = (ulong)(CARRY8(uVar25,uVar35) || CARRY8(uVar34,uVar33)) +
           (ulong)(CARRY8(uVar30,uVar36) || CARRY8(uVar27,uVar24)) +
           (ulong)(CARRY8(uVar31,uVar36) || CARRY8(uVar28,uVar29));
  in_RDI[2] = uVar37 + uVar26;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_RSI[3];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *in_RSI;
  uVar38 = SUB168(auVar5 * auVar15,8);
  uVar24 = SUB168(auVar5 * auVar15,0);
  uVar29 = uVar32 + uVar24;
  uVar33 = (ulong)CARRY8(uVar32,uVar24);
  uVar27 = uVar30 + uVar38;
  uVar32 = uVar27 + uVar33;
  uVar34 = uVar29 + uVar24;
  uVar24 = (ulong)CARRY8(uVar29,uVar24);
  uVar28 = uVar32 + uVar38;
  uVar35 = uVar28 + uVar24;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_RSI[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = in_RSI[1];
  uVar39 = SUB168(auVar6 * auVar16,8);
  uVar31 = SUB168(auVar6 * auVar16,0);
  uVar40 = uVar34 + uVar31;
  uVar29 = (ulong)CARRY8(uVar34,uVar31);
  uVar25 = uVar35 + uVar39;
  uVar36 = uVar25 + uVar29;
  uVar34 = (ulong)CARRY8(uVar40,uVar31);
  uVar26 = uVar36 + uVar39;
  uVar37 = uVar26 + uVar34;
  uVar25 = (ulong)(CARRY8(uVar30,uVar38) || CARRY8(uVar27,uVar33)) +
           (ulong)(CARRY8(uVar32,uVar38) || CARRY8(uVar28,uVar24)) +
           (ulong)(CARRY8(uVar35,uVar39) || CARRY8(uVar25,uVar29)) +
           (ulong)(CARRY8(uVar36,uVar39) || CARRY8(uVar26,uVar34));
  in_RDI[3] = uVar40 + uVar31;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = in_RSI[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = in_RSI[2];
  uVar35 = SUB168(auVar7 * auVar17,8);
  uVar33 = SUB168(auVar7 * auVar17,0);
  uVar24 = uVar37 + uVar33;
  uVar33 = (ulong)CARRY8(uVar37,uVar33);
  uVar34 = uVar25 + uVar35;
  uVar30 = uVar34 + uVar33;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = in_RSI[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = in_RSI[1];
  uVar36 = SUB168(auVar8 * auVar18,8);
  uVar26 = SUB168(auVar8 * auVar18,0);
  uVar37 = uVar24 + uVar26;
  uVar24 = (ulong)CARRY8(uVar24,uVar26);
  uVar27 = uVar30 + uVar36;
  uVar31 = uVar27 + uVar24;
  uVar29 = (ulong)CARRY8(uVar37,uVar26);
  uVar28 = uVar31 + uVar36;
  uVar32 = uVar28 + uVar29;
  uVar27 = (ulong)(CARRY8(uVar25,uVar35) || CARRY8(uVar34,uVar33)) +
           (ulong)(CARRY8(uVar30,uVar36) || CARRY8(uVar27,uVar24)) +
           (ulong)(CARRY8(uVar31,uVar36) || CARRY8(uVar28,uVar29));
  in_RDI[4] = uVar37 + uVar26;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_RSI[3];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = in_RSI[2];
  uVar26 = SUB168(auVar9 * auVar19,8);
  uVar28 = SUB168(auVar9 * auVar19,0);
  uVar30 = uVar32 + uVar28;
  uVar33 = (ulong)CARRY8(uVar32,uVar28);
  uVar29 = uVar27 + uVar26;
  uVar25 = uVar29 + uVar33;
  uVar24 = (ulong)CARRY8(uVar30,uVar28);
  uVar34 = uVar25 + uVar26;
  auVar21._8_8_ =
       (ulong)(CARRY8(uVar27,uVar26) || CARRY8(uVar29,uVar33)) +
       (ulong)(CARRY8(uVar25,uVar26) || CARRY8(uVar34,uVar24));
  auVar21._0_8_ = uVar34 + uVar24;
  in_RDI[5] = uVar30 + uVar28;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = in_RSI[3];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = in_RSI[3];
  *(undefined1 (*) [16])(in_RDI + 6) = auVar10 * auVar20 + auVar21;
  return;
}

Assistant:

void bn_sqr_comba4(BN_ULONG *r, const BN_ULONG *a)
{
    BN_ULONG c1, c2, c3;

    c1 = 0;
    c2 = 0;
    c3 = 0;
    sqr_add_c(a, 0, c1, c2, c3);
    r[0] = c1;
    c1 = 0;
    sqr_add_c2(a, 1, 0, c2, c3, c1);
    r[1] = c2;
    c2 = 0;
    sqr_add_c(a, 1, c3, c1, c2);
    sqr_add_c2(a, 2, 0, c3, c1, c2);
    r[2] = c3;
    c3 = 0;
    sqr_add_c2(a, 3, 0, c1, c2, c3);
    sqr_add_c2(a, 2, 1, c1, c2, c3);
    r[3] = c1;
    c1 = 0;
    sqr_add_c(a, 2, c2, c3, c1);
    sqr_add_c2(a, 3, 1, c2, c3, c1);
    r[4] = c2;
    c2 = 0;
    sqr_add_c2(a, 3, 2, c3, c1, c2);
    r[5] = c3;
    c3 = 0;
    sqr_add_c(a, 3, c1, c2, c3);
    r[6] = c1;
    r[7] = c2;
}